

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringNew *curr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  Literal *pLVar4;
  Literal *x;
  size_t i;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  shared_ptr<wasm::GCData> sVar10;
  string_view string;
  undefined1 local_2e0 [8];
  Flow start;
  ios_base local_260 [264];
  Literal local_158;
  Literal local_140;
  undefined1 auStack_128 [8];
  Literals contents;
  undefined1 local_e0 [8];
  Flow ptr;
  shared_ptr<wasm::GCData> ptrData;
  Flow end;
  
  visit((Flow *)local_e0,this,curr->ref);
  uVar9 = DAT_010d2618._4_4_;
  uVar8 = (undefined4)DAT_010d2618;
  uVar7 = NONCONSTANT_FLOW._4_4_;
  uVar6 = (undefined4)NONCONSTANT_FLOW;
  if (CONCAT44(ptr.breakTo.super_IString.str._M_len._4_4_,
               (undefined4)ptr.breakTo.super_IString.str._M_len) == 0) {
    if (curr->op == StringNewFromCodePoint) {
      if (((long)((long)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
          -0x5555555555555555 + (long)local_e0 != 1) goto LAB_00d39a3c;
      uVar1 = Literal::getUnsigned((Literal *)&ptr);
      if (0x10ffff < (uint)uVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"invalid code point");
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_2e0);
      String::writeWTF16CodePoint
                ((ostream *)&start.values.super_SmallVector<wasm::Literal,_1UL>.fixed,(uint)uVar1);
      std::__cxx11::stringbuf::str();
      string._M_str =
           (char *)ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
      string._M_len = end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      Literal::Literal(&local_140,string);
      Flow::Flow(__return_storage_ptr__,&local_140);
      Literal::~Literal(&local_140);
      if (ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          &end.values.super_SmallVector<wasm::Literal,_1UL>.fixed) {
        operator_delete(ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,
                        end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                        i64 + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_2e0);
      std::ios_base::~ios_base(local_260);
      goto LAB_00d395fb;
    }
    if (curr->op == StringNewWTF16Array) {
      visit((Flow *)local_2e0,this,curr->start);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,this,curr->end);
        if (end.breakTo.super_IString.str._M_len == 0) {
          if (((long)((long)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
              3) * -0x5555555555555555 + (long)local_e0 != 1) {
LAB_00d39a3c:
            __assert_fail("values.size() == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                          ,0x52,"const Literal &wasm::Flow::getSingleValue()");
          }
          sVar10 = Literal::getGCData((Literal *)&ptr.breakTo.super_IString.str._M_str);
          if (ptr.breakTo.super_IString.str._M_str == (char *)0x0) {
            (*this->_vptr_ExpressionRunner[2])
                      (this,"null ref",
                       sVar10.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
          }
          if (((long)((long)start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
              >> 3) * -0x5555555555555555 + (long)local_2e0 != 1) goto LAB_00d39a3c;
          end.breakTo.super_IString.str._M_str = ptr.breakTo.super_IString.str._M_str;
          uVar1 = Literal::getUnsigned((Literal *)&start);
          if (((long)((long)end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
              3) * -0x5555555555555555 +
              (long)ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi != 1) goto LAB_00d39a3c;
          uVar2 = Literal::getUnsigned((Literal *)&end);
          uVar3 = (*(long *)(end.breakTo.super_IString.str._M_str + 0x30) -
                   *(long *)(end.breakTo.super_IString.str._M_str + 0x28) >> 3) *
                  -0x5555555555555555 + *(long *)(end.breakTo.super_IString.str._M_str + 8);
          if (((uVar3 < uVar1) || (uVar2 < uVar1)) || (uVar3 < uVar2)) {
            (*this->_vptr_ExpressionRunner[2])(this,"array oob");
          }
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str = (char *)0x0;
          auStack_128 = (undefined1  [8])0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar3 = uVar2 - uVar1;
          if (uVar1 <= uVar2 && uVar3 != 0) {
            if (1 < uVar3) {
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::reserve
                        ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                         &contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,
                         uVar3 - 1);
            }
            if (uVar1 < uVar2) {
              pLVar4 = (Literal *)(end.breakTo.super_IString.str._M_str + 0x10);
              lVar5 = uVar1 * 0x18 + -0x18;
              do {
                x = (Literal *)(*(long *)(end.breakTo.super_IString.str._M_str + 0x28) + lVar5);
                if (uVar1 == 0) {
                  x = pLVar4;
                }
                SmallVector<wasm::Literal,_1UL>::push_back
                          ((SmallVector<wasm::Literal,_1UL> *)auStack_128,x);
                uVar1 = uVar1 + 1;
                lVar5 = lVar5 + 0x18;
              } while (uVar2 != uVar1);
            }
          }
          makeGCData(&local_158,this,(Literals *)auStack_128,
                     (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)82>).
                           super_Expression.type.id);
          Flow::Flow(__return_storage_ptr__,&local_158);
          Literal::~Literal(&local_158);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                     &contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
          Literal::~Literal((Literal *)&contents);
          if (ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
        else {
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
               (size_t)ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
          Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                           fixed._M_elems,(Literal *)&end);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish =
               end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish;
          end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len =
               (size_t)end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str =
               (char *)end.breakTo.super_IString.str._M_len;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        Literal::~Literal((Literal *)&end);
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)local_2e0;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&start);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)start.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&start);
      goto LAB_00d395fb;
    }
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_e0;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&ptr);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar6 = ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_;
    uVar7 = ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    uVar8 = (undefined4)ptr.breakTo.super_IString.str._M_len;
    uVar9 = ptr.breakTo.super_IString.str._M_len._4_4_;
  }
  *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar6;
  *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) = uVar7;
  *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str = uVar8;
  *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) = uVar9;
LAB_00d395fb:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&ptr);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringNew(StringNew* curr) {
    Flow ptr = visit(curr->ref);
    if (ptr.breaking()) {
      return ptr;
    }
    switch (curr->op) {
      case StringNewWTF16Array: {
        Flow start = visit(curr->start);
        if (start.breaking()) {
          return start;
        }
        Flow end = visit(curr->end);
        if (end.breaking()) {
          return end;
        }
        auto ptrData = ptr.getSingleValue().getGCData();
        if (!ptrData) {
          trap("null ref");
        }
        const auto& ptrDataValues = ptrData->values;
        size_t startVal = start.getSingleValue().getUnsigned();
        size_t endVal = end.getSingleValue().getUnsigned();
        if (startVal > ptrDataValues.size() || endVal > ptrDataValues.size() ||
            endVal < startVal) {
          trap("array oob");
        }
        Literals contents;
        if (endVal > startVal) {
          contents.reserve(endVal - startVal);
          for (size_t i = startVal; i < endVal; i++) {
            contents.push_back(ptrDataValues[i]);
          }
        }
        return makeGCData(std::move(contents), curr->type);
      }
      case StringNewFromCodePoint: {
        uint32_t codePoint = ptr.getSingleValue().getUnsigned();
        if (codePoint > 0x10FFFF) {
          trap("invalid code point");
        }
        std::stringstream wtf16;
        String::writeWTF16CodePoint(wtf16, codePoint);
        std::string str = wtf16.str();
        return Literal(str);
      }
      default:
        // TODO: others
        return Flow(NONCONSTANT_FLOW);
    }
  }